

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_schnorrsig_sign_custom
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_keypair *keypair,secp256k1_schnorrsig_extraparams *extraparams)

{
  int iVar1;
  long in_RDI;
  void *in_R9;
  void *ndata;
  secp256k1_nonce_function_hardened noncefp;
  secp256k1_nonce_function_hardened in_stack_000001a0;
  secp256k1_keypair *in_stack_000001a8;
  size_t in_stack_000001b0;
  uchar *in_stack_000001b8;
  uchar *in_stack_000001c0;
  secp256k1_context *in_stack_000001c8;
  void *in_stack_000001e0;
  char *in_stack_ffffffffffffffa8;
  secp256k1_callback *in_stack_ffffffffffffffb0;
  int local_4;
  
  if (in_RDI != 0) {
    if ((in_R9 == (void *)0x0) ||
       (iVar1 = secp256k1_memcmp_var(in_R9,schnorrsig_extraparams_magic,4), iVar1 == 0)) {
      local_4 = secp256k1_schnorrsig_sign_internal
                          (in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,in_stack_000001b0,
                           in_stack_000001a8,in_stack_000001a0,in_stack_000001e0);
    }
    else {
      secp256k1_callback_call(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      local_4 = 0;
    }
    return local_4;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/schnorrsig/main_impl.h"
          ,0xd3,"test condition failed: ctx != NULL");
  abort();
}

Assistant:

int secp256k1_schnorrsig_sign_custom(const secp256k1_context* ctx, unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_keypair *keypair, secp256k1_schnorrsig_extraparams *extraparams) {
    secp256k1_nonce_function_hardened noncefp = NULL;
    void *ndata = NULL;
    VERIFY_CHECK(ctx != NULL);

    if (extraparams != NULL) {
        ARG_CHECK(secp256k1_memcmp_var(extraparams->magic,
                                       schnorrsig_extraparams_magic,
                                       sizeof(extraparams->magic)) == 0);
        noncefp = extraparams->noncefp;
        ndata = extraparams->ndata;
    }
    return secp256k1_schnorrsig_sign_internal(ctx, sig64, msg, msglen, keypair, noncefp, ndata);
}